

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  char *__nptr;
  long lVar2;
  uint output;
  char *paramFile;
  int i;
  long lVar3;
  char *scene;
  int argc_local;
  char *local_88;
  double **P;
  char **argv_local;
  double **V;
  double **U;
  lattice grid;
  
  argc_local = argc;
  argv_local = argv;
  MPI_Init(&argc_local,&argv_local);
  if (argc_local < 3) {
    MPI_Comm_rank(&ompi_mpi_comm_world,&grid);
    if (grid.delx._0_4_ == 0) {
      puts(
          "Usage: simulator <scene>\n                 [-p\"parameter_file\"]\n                 [-i\"image_file]\"\n                 [number_of_frames]"
          );
      puts(
          "When specifying both an image and a parameter file, the sizes specified from the image take precedence!"
          );
    }
  }
  else {
    U = (double **)0x0;
    V = (double **)0x0;
    P = (double **)0x0;
    paramFile = (char *)0x0;
    local_88 = (char *)0x0;
    scene = (char *)0x0;
    output = 0;
    for (lVar3 = 1; lVar3 < argc_local; lVar3 = lVar3 + 1) {
      __nptr = argv_local[lVar3];
      if (*__nptr == '-') {
        cVar1 = __nptr[1];
        if (cVar1 == 'i') {
          local_88 = __nptr + 2;
        }
        else if (cVar1 == 'p') {
          paramFile = __nptr + 2;
        }
        else if (cVar1 == 'v') {
          output = output | 1;
        }
        else {
          printf("Unrecognized option %s\n");
        }
      }
      else {
        grid.delx = (double)anon_var_dwarf_97;
        lVar2 = strtol(__nptr,(char **)&grid,0);
        if (*(char *)grid.delx == '\0') {
          output = (int)lVar2 << 4 | output;
        }
        else {
          scene = argv_local[lVar3];
        }
      }
    }
    runSimulation(&grid,&U,&V,&P,scene,paramFile,local_88,output);
    destroy2Dfield(U,grid.deli + 3);
    destroy2Dfield(V,grid.deli + 2);
    destroy2Dfield(P,grid.deli + 2);
  }
  MPI_Finalize();
  return 0;
}

Assistant:

int main (int argc, char **argv)
{
	MPI_Init(&argc,&argv);
	if (argc < 3)
	{
		int rank;
		MPI_Comm_rank(MPI_COMM_WORLD,&rank);
		if (rank == 0)
		{
			printf("Usage: simulator <scene>\n"
					"                 [-p\"parameter_file\"]\n"
					"                 [-i\"image_file]\"\n"
					"                 [number_of_frames]\n");
			printf("When specifying both an image and a parameter file, "
					"the sizes specified from the image take precedence!\n");
		}
		MPI_Finalize();
		return 0;
	}
	REAL **U = NULL, **V = NULL, **P = NULL;
	char *paramFile = NULL;
	char *imageFile = NULL;
	char *scene = NULL;
	int output = SILENT;

	for (int i = 1; i < argc; i++)
	{
		if (argv[i][0] != '-')
		{
			char *endptr = "\0";
			int out = strtol(argv[i],&endptr,0);
			if (endptr[0] == '\0')
				output |= out*OUTPUT;
			else
				scene = argv[i];
			continue;
		}
		switch (argv[i][1])
		{
			case 'v':
				output |= PRINT;
				break;
			case 'p':
				paramFile = argv[i]+2;
				break;
			case 'i':
				imageFile = argv[i]+2;
				break;
			default:
				printf("Unrecognized option %s\n",argv[i]);
				break;
		}
	}
	lattice grid = runSimulation(&U,&V,&P,scene,paramFile,imageFile,output);
	//writeHorizontal(U,grid.deli,grid.delj,"hor.dat");
	/* Destroy simulated grids */
	destroy2Dfield((void**)U,grid.deli+3);
	destroy2Dfield((void**)V,grid.deli+2);
	destroy2Dfield((void**)P,grid.deli+2);
	MPI_Finalize();
	return 0;
}